

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

MTBDDMAP mtbdd_map_removeall(MTBDDMAP map,MTBDD variables)

{
  uint8_t *puVar1;
  ulong uVar2;
  MTBDDMAP low;
  MTBDD MVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  uint var;
  
  if (map != 0) {
    puVar1 = nodes->data;
    do {
      lVar6 = (map & 0xffffffffff) * 0x10;
      uVar2 = *(ulong *)(puVar1 + lVar6 + 8);
      while( true ) {
        lVar4 = (variables & 0xffffffffff) * 0x10;
        var = (uint)(uVar2 >> 0x28);
        uVar5 = (uint)((ulong)*(undefined8 *)(puVar1 + lVar4 + 8) >> 0x28);
        if (var < uVar5) {
          low = mtbdd_map_removeall(uVar2 & 0xffffffffff | map & 0x8000000000000000,variables);
          MVar3 = mtbdd_makemapnode(var,low,*(ulong *)(puVar1 + lVar6) & 0x800000ffffffffff ^
                                            map & 0x8000000000000000);
          return MVar3;
        }
        if (var <= uVar5) break;
        variables = variables & 0x8000000000000000 ^ *(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff
        ;
        if (variables == 0x8000000000000000) {
          return map;
        }
      }
      map = map & 0x8000000000000000 | uVar2 & 0xffffffffff;
    } while ((map != 0) &&
            (variables = variables & 0x8000000000000000 ^
                         *(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff,
            variables != 0x8000000000000000));
  }
  return map;
}

Assistant:

MTBDDMAP
mtbdd_map_removeall(MTBDDMAP map, MTBDD variables)
{
    if (mtbdd_map_isempty(map)) return map;
    if (variables == mtbdd_true) return map;

    mtbddnode_t n1 = MTBDD_GETNODE(map);
    mtbddnode_t n2 = MTBDD_GETNODE(variables);
    uint32_t k1 = mtbddnode_getvariable(n1);
    uint32_t k2 = mtbddnode_getvariable(n2);

    if (k1 < k2) {
        MTBDDMAP low = mtbdd_map_removeall(node_getlow(map, n1), variables);
        return mtbdd_makemapnode(k1, low, node_gethigh(map, n1));
    } else if (k1 > k2) {
        return mtbdd_map_removeall(map, node_gethigh(variables, n2));
    } else {
        return mtbdd_map_removeall(node_getlow(map, n1), node_gethigh(variables, n2));
    }
}